

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::ThreadMessageHandler(CConnman *this)

{
  long lVar1;
  CNode *pCVar2;
  bool bVar3;
  vector<CNode_*,_std::allocator<CNode_*>_> *pszFile;
  reference ppCVar4;
  anon_class_8_1_8991fb9c in_RDI;
  long in_FS_OFFSET;
  bool fMoreNodeWork;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range2;
  bool fMoreWork;
  const_iterator __end2;
  const_iterator __begin2;
  NodesSnapshot snap;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock83;
  Mutex *in_stack_ffffffffffffff18;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffff20;
  condition_variable *in_stack_ffffffffffffff28;
  unique_lock<std::mutex> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  byte in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  char *in_stack_ffffffffffffff40;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar5;
  uint in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff77;
  CConnman *in_stack_ffffffffffffff78;
  uint7 in_stack_ffffffffffffff80;
  byte bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffff18);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             &(in_stack_ffffffffffffff50.this)->m_total_bytes_sent_mutex,(char *)in_RDI.this,
             in_stack_ffffffffffffff40,
             CONCAT13(in_stack_ffffffffffffff3f,
                      CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)),
             SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
  while (bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff30),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    bVar6 = 0;
    NodesSnapshot::NodesSnapshot
              ((NodesSnapshot *)(ulong)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (bool)in_stack_ffffffffffffff77);
    pszFile = NodesSnapshot::Nodes((NodesSnapshot *)in_stack_ffffffffffffff18);
    std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff20.__d.__r);
    std::vector<CNode_*,_std::allocator<CNode_*>_>::end
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff20.__d.__r);
    while (bVar3 = __gnu_cxx::
                   operator==<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             ((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                               *)in_stack_ffffffffffffff28,
                              (__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                               *)in_stack_ffffffffffffff20.__d.__r), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
                operator*((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           *)in_stack_ffffffffffffff18);
      pCVar2 = *ppCVar4;
      bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff30);
      if (!bVar3) {
        iVar5 = (*(in_RDI.this)->m_msgproc->_vptr_NetEventsInterface[3])
                          ((in_RDI.this)->m_msgproc,pCVar2,&(in_RDI.this)->flagInterruptMsgProc);
        in_stack_ffffffffffffff3f = (undefined1)iVar5;
        in_stack_ffffffffffffff5c =
             CONCAT13(in_stack_ffffffffffffff3f,(int3)in_stack_ffffffffffffff5c) & 0x1ffffff;
        in_stack_ffffffffffffff3e = 0;
        if ((char)(in_stack_ffffffffffffff5c >> 0x18) != '\0') {
          bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff30);
          in_stack_ffffffffffffff3e = bVar3 ^ 0xff;
        }
        bVar6 = (bVar6 & 1) != 0 || (in_stack_ffffffffffffff3e & 1) != 0;
        bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff30);
        if (bVar3) {
          iVar5 = 1;
          goto LAB_0100bdd5;
        }
        (*(in_RDI.this)->m_msgproc->_vptr_NetEventsInterface[4])((in_RDI.this)->m_msgproc,pCVar2);
        bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff30);
        if (bVar3) {
          iVar5 = 1;
          goto LAB_0100bdd5;
        }
      }
      __gnu_cxx::__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
      ::operator++((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                    *)in_stack_ffffffffffffff18);
    }
    iVar5 = 0;
LAB_0100bdd5:
    NodesSnapshot::~NodesSnapshot((NodesSnapshot *)in_stack_ffffffffffffff28);
    if (iVar5 != 0) break;
    in_stack_ffffffffffffff30 =
         (unique_lock<std::mutex> *)MaybeCheckNotHeld(in_stack_ffffffffffffff18);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)CONCAT44(in_stack_ffffffffffffff5c,iVar5),
               &(in_stack_ffffffffffffff50.this)->m_total_bytes_sent_mutex,(char *)in_RDI.this,
               (char *)pszFile,
               CONCAT13(in_stack_ffffffffffffff3f,
                        CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)),
               SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
    if ((bVar6 & 1) == 0) {
      in_stack_ffffffffffffff28 = &(in_RDI.this)->condMsgProc;
      std::chrono::_V2::steady_clock::now();
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff18,
                 (int *)0x100be75);
      in_stack_ffffffffffffff20 =
           std::chrono::operator+
                     ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_ffffffffffffff20.__d.__r,
                      (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff50.this = in_RDI.this;
      std::condition_variable::
      wait_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,CConnman::ThreadMessageHandler()::__0>
                ((condition_variable *)
                 CONCAT17(in_stack_ffffffffffffff3f,
                          CONCAT16(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))),
                 in_stack_ffffffffffffff30,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_ffffffffffffff28,in_RDI);
    }
    (in_RDI.this)->fMsgProcWake = false;
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff18);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadMessageHandler()
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    while (!flagInterruptMsgProc)
    {
        bool fMoreWork = false;

        {
            // Randomize the order in which we process messages from/to our peers.
            // This prevents attacks in which an attacker exploits having multiple
            // consecutive connections in the m_nodes list.
            const NodesSnapshot snap{*this, /*shuffle=*/true};

            for (CNode* pnode : snap.Nodes()) {
                if (pnode->fDisconnect)
                    continue;

                // Receive messages
                bool fMoreNodeWork = m_msgproc->ProcessMessages(pnode, flagInterruptMsgProc);
                fMoreWork |= (fMoreNodeWork && !pnode->fPauseSend);
                if (flagInterruptMsgProc)
                    return;
                // Send messages
                m_msgproc->SendMessages(pnode);

                if (flagInterruptMsgProc)
                    return;
            }
        }

        WAIT_LOCK(mutexMsgProc, lock);
        if (!fMoreWork) {
            condMsgProc.wait_until(lock, std::chrono::steady_clock::now() + std::chrono::milliseconds(100), [this]() EXCLUSIVE_LOCKS_REQUIRED(mutexMsgProc) { return fMsgProcWake; });
        }
        fMsgProcWake = false;
    }
}